

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QXcbConnection::TabletData>::moveAppend
          (QGenericArrayOps<QXcbConnection::TabletData> *this,TabletData *b,TabletData *e)

{
  undefined8 *puVar1;
  TabletData *pTVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  qsizetype qVar5;
  Data *pDVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  TabletData *pTVar10;
  DeviceType DVar11;
  qsizetype qVar12;
  
  if ((b != e) && (b < e)) {
    pTVar2 = (this->super_QArrayDataPointer<QXcbConnection::TabletData>).ptr;
    qVar12 = (this->super_QArrayDataPointer<QXcbConnection::TabletData>).size;
    do {
      pTVar2[qVar12].deviceId = b->deviceId;
      pDVar3 = (b->name).d.d;
      (b->name).d.d = (Data *)0x0;
      pTVar2[qVar12].name.d.d = pDVar3;
      pcVar4 = (b->name).d.ptr;
      (b->name).d.ptr = (char16_t *)0x0;
      pTVar2[qVar12].name.d.ptr = pcVar4;
      qVar5 = (b->name).d.size;
      (b->name).d.size = 0;
      pTVar2[qVar12].name.d.size = qVar5;
      DVar11 = b->tool;
      uVar7 = *(undefined8 *)&b->buttons;
      uVar8 = *(undefined8 *)
               ((long)&(b->buttons).super_QFlagsStorageHelper<Qt::MouseButton,_4>.
                       super_QFlagsStorage<Qt::MouseButton>.i + 1);
      uVar9 = *(undefined8 *)((long)&b->serialId + 1);
      pTVar10 = pTVar2 + qVar12;
      pTVar10->pointerType = b->pointerType;
      pTVar10->tool = DVar11;
      *(undefined8 *)(&pTVar10->pointerType + 2) = uVar7;
      puVar1 = (undefined8 *)
               ((long)&pTVar2[qVar12].buttons.super_QFlagsStorageHelper<Qt::MouseButton,_4>.
                       super_QFlagsStorage<Qt::MouseButton>.i + 1);
      *puVar1 = uVar8;
      puVar1[1] = uVar9;
      pDVar6 = (b->valuatorInfo).d;
      (b->valuatorInfo).d = (Data *)0x0;
      pTVar2[qVar12].valuatorInfo.d = pDVar6;
      b = b + 1;
      qVar12 = (this->super_QArrayDataPointer<QXcbConnection::TabletData>).size + 1;
      (this->super_QArrayDataPointer<QXcbConnection::TabletData>).size = qVar12;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }